

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_SamePackageUnusedImportError_Test::
TestBody(ValidationErrorTest_SamePackageUnusedImportError_Test *this)

{
  string_view file_text;
  string_view file_text_00;
  string_view file_name;
  allocator<char> local_41;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_28;
  
  file_text._M_str =
       "\n    name: \"unused_dependency.proto\"\n    package: \"proto2_unittest.subpackage\"\n    message_type { name: \"Foo\" }\n  "
  ;
  file_text._M_len = 0x72;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  file_text_00._M_str =
       "\n    name: \"used_dependency.proto\"\n    package: \"proto2_unittest.subpackage\"\n    message_type { name: \"Bar\" }\n  "
  ;
  file_text_00._M_len = 0x70;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text_00);
  file_name._M_str = "import.proto";
  file_name._M_len = 0xc;
  DescriptorPool::AddDirectInputFile(&(this->super_ValidationErrorTest).pool_,file_name,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\n                        name: \"import.proto\"\n                        package: \"proto2_unittest\"\n                        dependency: \"unused_dependency.proto\"\n                        dependency: \"used_dependency.proto\"\n                        message_type {\n                          name: \"Baz\"\n                          field {\n                            name: \"bar\"\n                            number: 1\n                            label: LABEL_OPTIONAL\n                            type: TYPE_MESSAGE\n                            type_name: \"subpackage.Bar\"\n                          }\n                        }\n                      "
             ,&local_41);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40,
            "import.proto: unused_dependency.proto: IMPORT: Import unused_dependency.proto is unused.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_28,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_40);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, SamePackageUnusedImportError) {
  BuildFile(R"pb(
    name: "unused_dependency.proto"
    package: "proto2_unittest.subpackage"
    message_type { name: "Foo" }
  )pb");

  BuildFile(R"pb(
    name: "used_dependency.proto"
    package: "proto2_unittest.subpackage"
    message_type { name: "Bar" }
  )pb");

  pool_.AddDirectInputFile("import.proto", true);
  BuildFileWithErrors(R"pb(
                        name: "import.proto"
                        package: "proto2_unittest"
                        dependency: "unused_dependency.proto"
                        dependency: "used_dependency.proto"
                        message_type {
                          name: "Baz"
                          field {
                            name: "bar"
                            number: 1
                            label: LABEL_OPTIONAL
                            type: TYPE_MESSAGE
                            type_name: "subpackage.Bar"
                          }
                        }
                      )pb",
                      "import.proto: unused_dependency.proto: "
                      "IMPORT: Import unused_dependency.proto is unused.\n");
}